

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

int ncnn_extractor_extract(ncnn_extractor_t ex,char *name,ncnn_mat_t *mat)

{
  int iVar1;
  Mat *this;
  Mat mat0;
  
  mat0.cstep = 0;
  mat0.data = (void *)0x0;
  mat0.refcount._0_4_ = 0;
  mat0.refcount._4_4_ = 0;
  mat0.elemsize._0_4_ = 0;
  mat0._20_8_ = 0;
  mat0.allocator = (Allocator *)0x0;
  mat0.dims = 0;
  mat0.w = 0;
  mat0.h = 0;
  mat0.d = 0;
  mat0.c = 0;
  iVar1 = ncnn::Extractor::extract((Extractor *)ex,name,&mat0,0);
  this = (Mat *)operator_new(0x48);
  ncnn::Mat::Mat(this,&mat0);
  *mat = (ncnn_mat_t)this;
  ncnn::Mat::~Mat(&mat0);
  return iVar1;
}

Assistant:

int ncnn_extractor_extract(ncnn_extractor_t ex, const char* name, ncnn_mat_t* mat)
{
    Mat mat0;
    int ret = ((Extractor*)ex)->extract(name, mat0);
    *mat = (ncnn_mat_t)(new Mat(mat0));
    return ret;
}